

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Parsing.c
# Opt level: O2

WJTL_STATUS
VerifyJsonParsesAsListOfNumbers
          (_Bool IsJson5,char *Json,uint64_t *NumberArray,size_t NumberArrayCount)

{
  JlDataObject *pJVar1;
  size_t sVar2;
  JL_STATUS JVar3;
  JL_DATA_TYPE JVar4;
  uint32_t uVar5;
  JL_STATUS JVar6;
  size_t sVar7;
  WJTL_STATUS WVar8;
  size_t sVar9;
  JlDataObject *object;
  JlDataObject *listObject;
  uint64_t u64;
  size_t errorAtPos;
  JlDataObject *local_68;
  JlDataObject *local_60;
  uint64_t local_58;
  JlListItem *local_50;
  uint64_t *local_48;
  size_t local_40;
  size_t local_38;
  
  local_60 = (JlDataObject *)0x0;
  local_38 = 100;
  local_68 = (JlDataObject *)0x0;
  JVar3 = JlParseJsonEx(Json,IsJson5,&local_60,&local_38);
  WjTestLib_Assert(JVar3 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlParseJsonEx( Json, IsJson5, &listObject, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsListOfNumbers",0x20d);
  pJVar1 = local_60;
  WVar8 = WJTL_STATUS_FAILED;
  if (JVar3 == JL_STATUS_SUCCESS) {
    local_48 = NumberArray;
    WjTestLib_Assert(local_60 != (JlDataObject *)0x0,"(listObject) != NULL",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsListOfNumbers",0x210);
    JVar4 = JlGetObjectType(local_60);
    WjTestLib_Assert(JVar4 == JL_DATA_TYPE_LIST,"JlGetObjectType( listObject ) == JL_DATA_TYPE_LIST"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsListOfNumbers",0x211);
    sVar2 = local_38;
    WjTestLib_Assert(local_38 == 0,"errorAtPos == 0",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsListOfNumbers",0x212);
    uVar5 = JlGetListCount(local_60);
    sVar7 = 0;
    sVar9 = 0xfffffc18;
    if (uVar5 == NumberArrayCount) {
      sVar9 = sVar7;
    }
    if (sVar2 != 0) {
      sVar9 = 0xfffffc18;
    }
    if (JVar4 != JL_DATA_TYPE_LIST) {
      sVar9 = 0xfffffc18;
    }
    if (pJVar1 == (JlDataObject *)0x0) {
      sVar9 = 0xfffffc18;
    }
    local_40 = NumberArrayCount;
    WjTestLib_Assert(uVar5 == NumberArrayCount,"JlGetListCount( listObject ) == NumberArrayCount",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsListOfNumbers",0x214);
    local_50 = (JlListItem *)0x0;
    for (; WVar8 = (WJTL_STATUS)sVar9, local_40 != sVar7; sVar7 = sVar7 + 1) {
      local_58 = 0xffffffffffffffff;
      local_68 = (JlDataObject *)0x0;
      JVar3 = JlGetObjectListNextItem(local_60,&local_68,&local_50);
      WjTestLib_Assert(JVar3 == JL_STATUS_SUCCESS,
                       "((JL_STATUS)(JlGetObjectListNextItem( listObject, &object, &enumerator ))) == (JL_STATUS_SUCCESS)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                       ,"VerifyJsonParsesAsListOfNumbers",0x21c);
      pJVar1 = local_68;
      WjTestLib_Assert(local_68 != (JlDataObject *)0x0,"(object) != NULL",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                       ,"VerifyJsonParsesAsListOfNumbers",0x21d);
      JVar6 = JlGetObjectNumberU64(local_68,&local_58);
      WjTestLib_Assert(JVar6 == JL_STATUS_SUCCESS,
                       "((JL_STATUS)(JlGetObjectNumberU64( object, &u64 ))) == (JL_STATUS_SUCCESS)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                       ,"VerifyJsonParsesAsListOfNumbers",0x21e);
      if (local_58 != local_48[sVar7]) {
        sVar9 = 0xfffffc18;
      }
      if (JVar6 != JL_STATUS_SUCCESS || JVar3 != JL_STATUS_SUCCESS) {
        sVar9 = 0xfffffc18;
      }
      if (pJVar1 == (JlDataObject *)0x0) {
        sVar9 = 0xfffffc18;
      }
      WjTestLib_Assert(local_58 == local_48[sVar7],"u64 == NumberArray[i]",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                       ,"VerifyJsonParsesAsListOfNumbers",0x21f);
    }
    JVar3 = JlGetObjectListNextItem(local_60,&local_68,&local_50);
    WjTestLib_Assert(JVar3 == JL_STATUS_END_OF_DATA,
                     "(JlGetObjectListNextItem( listObject, &object, &enumerator )) == (JL_STATUS_END_OF_DATA)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsListOfNumbers",0x223);
    JVar6 = JlFreeObjectTree(&local_60);
    if (JVar6 != JL_STATUS_SUCCESS) {
      WVar8 = WJTL_STATUS_FAILED;
    }
    if (JVar3 != JL_STATUS_END_OF_DATA) {
      WVar8 = WJTL_STATUS_FAILED;
    }
    WjTestLib_Assert(JVar6 == JL_STATUS_SUCCESS,
                     "((JL_STATUS)(JlFreeObjectTree( &listObject ))) == (JL_STATUS_SUCCESS)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsListOfNumbers",0x226);
  }
  return WVar8;
}

Assistant:

static
WJTL_STATUS
    VerifyJsonParsesAsListOfNumbers
    (
        bool            IsJson5,
        char const*     Json,
        uint64_t*       NumberArray,
        size_t          NumberArrayCount
    )
{
    JlDataObject*   listObject = NULL;
    size_t          errorAtPos = 100;
    WJTL_STATUS     TestReturn = WJTL_STATUS_SUCCESS;
    JlListItem*     enumerator = NULL;
    JlDataObject*   object = NULL;

    JL_ASSERT_SUCCESS( JlParseJsonEx( Json, IsJson5, &listObject, &errorAtPos ) );
    if( WJTL_STATUS_SUCCESS == TestReturn )
    {
        JL_ASSERT_NOT_NULL( listObject );
        JL_ASSERT( JlGetObjectType( listObject ) == JL_DATA_TYPE_LIST );
        JL_ASSERT( errorAtPos == 0 );

        JL_ASSERT( JlGetListCount( listObject ) == NumberArrayCount );

        // Verify all elements in list match array
        enumerator = NULL;
        for( size_t i=0; i<NumberArrayCount; i++ )
        {
            uint64_t u64 = UINT64_MAX;
            object = NULL;
            JL_ASSERT_SUCCESS( JlGetObjectListNextItem( listObject, &object, &enumerator ) );
            JL_ASSERT_NOT_NULL( object );
            JL_ASSERT_SUCCESS( JlGetObjectNumberU64( object, &u64 ) );
            JL_ASSERT( u64 == NumberArray[i] );
        }

        // Verify there are no more items in the list
        JL_ASSERT_STATUS( JlGetObjectListNextItem( listObject, &object, &enumerator ), JL_STATUS_END_OF_DATA );

        // Clean up
        JL_ASSERT_SUCCESS( JlFreeObjectTree( &listObject ) );
    }

    return TestReturn;
}